

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl_Still::release(Private_Impl_Still *this)

{
  if (this->_isInitialized == true) {
    disconnectPorts(this);
    destroyEncoder(this);
    if (this->camera != (MMAL_COMPONENT_T *)0x0) {
      mmal_component_destroy(this->camera);
      this->camera = (MMAL_COMPONENT_T *)0x0;
    }
    this->_isInitialized = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::release() {
            if ( !_isInitialized ) return;

            disconnectPorts();

            // camera and encoder are not disabled here because it cause destroy function to not do its job properly

            destroyEncoder();
            destroyCamera();

            _isInitialized=false;
        }